

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O0

void BuildAndStoreHuffmanTree
               (uint32_t *histogram,size_t histogram_length,size_t alphabet_size,HuffmanTree *tree,
               uint8_t *depth,uint16_t *bits,size_t *storage_ix,uint8_t *storage)

{
  ulong local_100;
  size_t max_bits_counter;
  size_t max_bits;
  size_t i;
  size_t s4 [4];
  ulong local_c0;
  size_t count;
  uint16_t *bits_local;
  uint8_t *depth_local;
  HuffmanTree *tree_local;
  size_t alphabet_size_local;
  size_t histogram_length_local;
  uint32_t *histogram_local;
  uint64_t v_1;
  uint8_t *p_1;
  uint64_t v;
  uint8_t *p;
  
  local_c0 = 0;
  memset(&i,0,0x20);
  max_bits_counter = 0;
  for (max_bits = 0; max_bits < histogram_length; max_bits = max_bits + 1) {
    if (histogram[max_bits] != 0) {
      if (local_c0 < 4) {
        s4[local_c0 - 1] = max_bits;
      }
      else if (4 < local_c0) break;
      local_c0 = local_c0 + 1;
    }
  }
  for (local_100 = alphabet_size - 1; local_100 != 0; local_100 = local_100 >> 1) {
    max_bits_counter = max_bits_counter + 1;
  }
  if (local_c0 < 2) {
    *(ulong *)(storage + (*storage_ix >> 3)) =
         1L << ((byte)*storage_ix & 7) | (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
    *storage_ix = *storage_ix + 4;
    *(size_t *)(storage + (*storage_ix >> 3)) =
         i << ((byte)*storage_ix & 7) | (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
    *storage_ix = max_bits_counter + *storage_ix;
    depth[i] = '\0';
    bits[i] = 0;
  }
  else {
    memset(depth,0,histogram_length);
    BrotliCreateHuffmanTree(histogram,histogram_length,0xf,tree,depth);
    BrotliConvertBitDepthsToSymbols(depth,histogram_length,bits);
    if (local_c0 < 5) {
      StoreSimpleHuffmanTree(depth,&i,local_c0,max_bits_counter,storage_ix,storage);
    }
    else {
      BrotliStoreHuffmanTree(depth,histogram_length,tree,storage_ix,storage);
    }
  }
  return;
}

Assistant:

static void BuildAndStoreHuffmanTree(const uint32_t* histogram,
                                     const size_t histogram_length,
                                     const size_t alphabet_size,
                                     HuffmanTree* tree,
                                     uint8_t* depth,
                                     uint16_t* bits,
                                     size_t* storage_ix,
                                     uint8_t* storage) {
  size_t count = 0;
  size_t s4[4] = { 0 };
  size_t i;
  size_t max_bits = 0;
  for (i = 0; i < histogram_length; i++) {
    if (histogram[i]) {
      if (count < 4) {
        s4[count] = i;
      } else if (count > 4) {
        break;
      }
      count++;
    }
  }

  {
    size_t max_bits_counter = alphabet_size - 1;
    while (max_bits_counter) {
      max_bits_counter >>= 1;
      ++max_bits;
    }
  }

  if (count <= 1) {
    BrotliWriteBits(4, 1, storage_ix, storage);
    BrotliWriteBits(max_bits, s4[0], storage_ix, storage);
    depth[s4[0]] = 0;
    bits[s4[0]] = 0;
    return;
  }

  memset(depth, 0, histogram_length * sizeof(depth[0]));
  BrotliCreateHuffmanTree(histogram, histogram_length, 15, tree, depth);
  BrotliConvertBitDepthsToSymbols(depth, histogram_length, bits);

  if (count <= 4) {
    StoreSimpleHuffmanTree(depth, s4, count, max_bits, storage_ix, storage);
  } else {
    BrotliStoreHuffmanTree(depth, histogram_length, tree, storage_ix, storage);
  }
}